

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signpost_intrinsic_triangulation.cpp
# Opt level: O2

void __thiscall
geometrycentral::surface::SignpostIntrinsicTriangulation::flipEdgeManual
          (SignpostIntrinsicTriangulation *this,Edge e,double newLength,double forwardAngle,
          double reverseAngle,bool isOrig,bool reverseFlip)

{
  Vector2 *pVVar1;
  bool bVar2;
  runtime_error *this_00;
  double *pdVar3;
  unsigned_long uVar4;
  size_t sVar5;
  int iVar6;
  undefined7 in_register_00000081;
  size_t i;
  Halfedge he;
  Halfedge he_00;
  Face f;
  Face f_00;
  Vector2 VVar7;
  
  sVar5 = e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind
  ;
  he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
       e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh;
  iVar6 = (int)CONCAT71(in_register_00000081,reverseFlip) + 2 +
          (int)CONCAT71(in_register_00000081,reverseFlip);
  do {
    iVar6 = iVar6 + -1;
    if (iVar6 == 0) {
      (this->intrinsicEdgeLengths).data.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[sVar5] =
           newLength;
      (this->super_IntrinsicGeometryInterface).edgeLengths.data.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[sVar5] =
           newLength;
      if ((he.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          mesh)->useImplicitTwinFlag == true) {
        uVar4 = sVar5 * 2;
        pdVar3 = (this->intrinsicHalfedgeDirections).data.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 sVar5 * 2 + 1;
        pdVar3[-1] = forwardAngle;
      }
      else {
        pdVar3 = (this->intrinsicHalfedgeDirections).data.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        pdVar3[((he.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh)->eHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[sVar5]] = forwardAngle;
        uVar4 = ((he.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .mesh)->eHalfedgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[sVar5];
        pdVar3 = pdVar3 + ((he.
                            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                           .mesh)->heSiblingArr).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4];
      }
      *pdVar3 = reverseAngle;
      he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      ind = uVar4;
      VVar7 = halfedgeVector(this,he);
      bVar2 = (he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->useImplicitTwinFlag;
      if (bVar2 == true) {
        uVar4 = sVar5 * 2;
      }
      else {
        uVar4 = ((he.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .mesh)->eHalfedgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[sVar5];
      }
      pVVar1 = (this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertex.data.
               super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      pVVar1[uVar4].x = VVar7.x;
      pVVar1[uVar4].y = VVar7.y;
      if (bVar2 == false) {
        uVar4 = ((he.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .mesh)->heSiblingArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start
                [((he.
                   super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .mesh)->eHalfedgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar5]];
      }
      else {
        uVar4 = sVar5 * 2 + 1;
      }
      he_00.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
      .ind = uVar4;
      he_00.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
      .mesh = he.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh;
      VVar7 = halfedgeVector(this,he_00);
      bVar2 = (he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->useImplicitTwinFlag;
      if (bVar2 == true) {
        uVar4 = sVar5 * 2 + 1;
      }
      else {
        uVar4 = ((he.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .mesh)->heSiblingArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start
                [((he.
                   super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .mesh)->eHalfedgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar5]];
      }
      pVVar1 = (this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertex.data.
               super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      pVVar1[uVar4].x = VVar7.x;
      pVVar1[uVar4].y = VVar7.y;
      if (bVar2 == false) {
        uVar4 = ((he.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .mesh)->eHalfedgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[sVar5];
      }
      else {
        uVar4 = sVar5 * 2;
      }
      f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
           ((he.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar4];
      f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
           he.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
           mesh;
      updateFaceBasis(this,f);
      if ((he.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          mesh)->useImplicitTwinFlag == true) {
        uVar4 = sVar5 * 2 + 1;
      }
      else {
        uVar4 = ((he.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .mesh)->heSiblingArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start
                [((he.
                   super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .mesh)->eHalfedgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar5]];
      }
      f_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind
           = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar4];
      f_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh
           = he.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh;
      updateFaceBasis(this,f_00);
      (this->edgeIsOriginal).data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.
      m_storage.m_data[sVar5] = isOrig;
      invokeEdgeFlipCallbacks(this,e);
      return;
    }
    bVar2 = SurfaceMesh::flip(&((this->intrinsicMesh)._M_t.
                                super___uniq_ptr_impl<geometrycentral::surface::ManifoldSurfaceMesh,_std::default_delete<geometrycentral::surface::ManifoldSurfaceMesh>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_geometrycentral::surface::ManifoldSurfaceMesh_*,_std::default_delete<geometrycentral::surface::ManifoldSurfaceMesh>_>
                                .
                                super__Head_base<0UL,_geometrycentral::surface::ManifoldSurfaceMesh_*,_false>
                               ._M_head_impl)->super_SurfaceMesh,e,false);
  } while (bVar2);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_00,"could not perform manual flip");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SignpostIntrinsicTriangulation::flipEdgeManual(Edge e, double newLength, double forwardAngle, double reverseAngle,
                                                    bool isOrig, bool reverseFlip) {

  int flipCount = reverseFlip ? 3 : 1; // three flips give opposite orientaiton
  for (int i = 0; i < flipCount; i++) {
    bool flipped = intrinsicMesh->flip(e, false);
    if (!flipped) throw std::runtime_error("could not perform manual flip");
  }

  intrinsicEdgeLengths[e] = newLength;
  edgeLengths[e] = newLength;

  // Update other derived geometric data
  intrinsicHalfedgeDirections[e.halfedge()] = forwardAngle;
  intrinsicHalfedgeDirections[e.halfedge().twin()] = reverseAngle;
  halfedgeVectorsInVertex[e.halfedge()] = halfedgeVector(e.halfedge());
  halfedgeVectorsInVertex[e.halfedge().twin()] = halfedgeVector(e.halfedge().twin());
  updateFaceBasis(e.halfedge().face());
  updateFaceBasis(e.halfedge().twin().face());

  edgeIsOriginal[e] = isOrig;
  invokeEdgeFlipCallbacks(e);
}